

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractscrollarea.cpp
# Opt level: O1

void __thiscall
QAbstractScrollAreaScrollBarContainer::addWidget
          (QAbstractScrollAreaScrollBarContainer *this,QWidget *widget,LogicalPosition position)

{
  QSizePolicy QVar1;
  int iVar2;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 policy;
  
  QVar1 = QWidget::sizePolicy(widget);
  policy.data = ((uint)QVar1.field_0 & 0xff0fffff) + 0xd00000;
  if (this->orientation == Vertical) {
    policy.data = (uint)QVar1.field_0 & 0xfff0ffff | 0xd0000;
  }
  QWidget::setSizePolicy(widget,(QSizePolicy)policy);
  QWidget::setParent(widget,&this->super_QWidget);
  iVar2 = 0;
  if ((position & LogicalLeft) == 0) {
    iVar2 = scrollBarLayoutIndex(this);
    iVar2 = iVar2 + 1;
  }
  QBoxLayout::insertWidget(this->layout,iVar2,widget,0,(Alignment)0x0);
  return;
}

Assistant:

void QAbstractScrollAreaScrollBarContainer::addWidget(QWidget *widget, LogicalPosition position)
{
    QSizePolicy policy = widget->sizePolicy();
    if (orientation == Qt::Vertical)
        policy.setHorizontalPolicy(QSizePolicy::Ignored);
    else
        policy.setVerticalPolicy(QSizePolicy::Ignored);
    widget->setSizePolicy(policy);
    widget->setParent(this);

    const int insertIndex = (position & LogicalLeft) ? 0 : scrollBarLayoutIndex() + 1;
    layout->insertWidget(insertIndex, widget);
}